

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::NonExistentMipMapTest::NonExistentMipMapTest
          (NonExistentMipMapTest *this,Context *context)

{
  undefined1 local_30 [8];
  testCase test_case;
  GLenum tex_target;
  GLuint target;
  Context *context_local;
  NonExistentMipMapTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"non_existent_mipmap",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for mipmap that does not exist"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NonExistentMipMapTest_0321e768;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case.m_expected_result = 0; test_case.m_expected_result < 0xb;
      test_case.m_expected_result = test_case.m_expected_result + 1) {
    local_30._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)test_case.m_expected_result * 4);
    local_30._4_4_ = 0;
    test_case.m_tex_target = 0;
    test_case.m_src_level = 0;
    if (local_30._0_4_ != 0x8d41) {
      test_case.m_dst_level = local_30._0_4_;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_30);
      test_case.m_src_level = 0x501;
      test_case.m_tex_target = 1;
      local_30._4_4_ = 0;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_30);
      test_case.m_tex_target = 0;
      local_30._4_4_ = 1;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_30);
      test_case.m_tex_target = 1;
      local_30._4_4_ = 1;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_30);
    }
  }
  return;
}

Assistant:

NonExistentMipMapTest::NonExistentMipMapTest(deqp::Context& context)
	: TestCase(context, "non_existent_mipmap", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											   "executed for mipmap that does not exist")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		testCase	 test_case  = { tex_target, 0, 0, GL_NO_ERROR };

		if (GL_RENDERBUFFER == tex_target)
		{
			continue;
		}

		m_test_cases.push_back(test_case);

		/* Rest of cases is invalid */
		test_case.m_expected_result = GL_INVALID_VALUE;

		test_case.m_dst_level = 1;
		test_case.m_src_level = 0;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 0;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 1;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);
	}
}